

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlsave(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  xmlDocPtr pxVar11;
  xmlNodePtr val;
  int nr;
  int test_ret_1;
  int iVar12;
  int n_doc;
  uint uVar13;
  xmlDocPtr in_RSI;
  undefined8 uVar14;
  int test_ret;
  int iVar15;
  undefined8 *puVar16;
  undefined4 *puVar17;
  int test_ret_2;
  int test_ret_5;
  uint local_38;
  
  if (quiet == '\0') {
    puts("Testing xmlsave : 9 of 15 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlSaveClose(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveClose");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar13 = 0;
  iVar15 = 0;
  do {
    iVar4 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    pxVar11 = gen_xmlDocPtr(uVar13,iVar4);
    in_RSI = pxVar11;
    xmlSaveDoc(0);
    call_tests = call_tests + 1;
    if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
      xmlFreeDoc(pxVar11);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSaveDoc",(ulong)(uint)(iVar4 - iVar3));
      iVar15 = iVar15 + 1;
      printf(" %d",0);
      in_RSI = (xmlDocPtr)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlSaveFinish(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveFinish");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlSaveFlush(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveFlush");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar16 = &DAT_0015ad48;
  uVar13 = 0;
  iVar12 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar13 < 3) {
      val = (xmlNodePtr)*puVar16;
    }
    else {
      val = (xmlNodePtr)0x0;
    }
    xmlSaveSetIndentString(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSaveSetIndentString",(ulong)(uint)(iVar8 - iVar7));
      iVar12 = iVar12 + 1;
      printf(" %d",0);
      val = (xmlNodePtr)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
    uVar13 = uVar13 + 1;
    puVar16 = puVar16 + 1;
  } while (uVar13 != 4);
  function_tests = function_tests + 1;
  uVar13 = 0;
  iVar7 = 0;
  do {
    iVar9 = (int)val;
    iVar8 = xmlMemBlocks();
    val = gen_xmlNodePtr(uVar13,iVar9);
    xmlSaveTree(0,val);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar13,val,nr);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSaveTree",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      val = (xmlNodePtr)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  function_tests = function_tests + 1;
  local_38 = (uint)(iVar5 != iVar6);
  puVar17 = &DAT_00158240;
  uVar13 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    xmlThrDefIndentTreeOutput(*puVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar6 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefIndentTreeOutput",(ulong)(uint)(iVar8 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",(ulong)uVar13);
      putchar(10);
    }
    uVar13 = uVar13 + 1;
    puVar17 = puVar17 + 1;
  } while (uVar13 != 4);
  function_tests = function_tests + 1;
  puVar17 = &DAT_00158240;
  uVar13 = 0;
  iVar6 = 0;
  do {
    iVar8 = xmlMemBlocks();
    xmlThrDefSaveNoEmptyTags(*puVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefSaveNoEmptyTags",(ulong)(uint)(iVar9 - iVar8));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar13);
      putchar(10);
    }
    uVar13 = uVar13 + 1;
    puVar17 = puVar17 + 1;
  } while (uVar13 != 4);
  function_tests = function_tests + 1;
  puVar16 = &DAT_0015ad48;
  uVar13 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar13 < 3) {
      uVar14 = *puVar16;
    }
    else {
      uVar14 = 0;
    }
    xmlThrDefTreeIndentString(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefTreeIndentString",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d",(ulong)uVar13);
      putchar(10);
    }
    uVar13 = uVar13 + 1;
    puVar16 = puVar16 + 1;
  } while (uVar13 != 4);
  function_tests = function_tests + 1;
  uVar13 = iVar12 + iVar7 + iVar15 + (uint)(iVar1 != iVar2) + (uint)(iVar3 != iVar4) + local_38 +
           iVar5 + iVar6 + iVar8;
  if (uVar13 != 0) {
    printf("Module xmlsave: %d errors\n",(ulong)uVar13);
  }
  return uVar13;
}

Assistant:

static int
test_xmlsave(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlsave : 9 of 15 functions ...\n");
    test_ret += test_xmlSaveClose();
    test_ret += test_xmlSaveDoc();
    test_ret += test_xmlSaveFinish();
    test_ret += test_xmlSaveFlush();
    test_ret += test_xmlSaveSetAttrEscape();
    test_ret += test_xmlSaveSetEscape();
    test_ret += test_xmlSaveSetIndentString();
    test_ret += test_xmlSaveToBuffer();
    test_ret += test_xmlSaveToFd();
    test_ret += test_xmlSaveToFilename();
    test_ret += test_xmlSaveTree();
    test_ret += test_xmlThrDefIndentTreeOutput();
    test_ret += test_xmlThrDefSaveNoEmptyTags();
    test_ret += test_xmlThrDefTreeIndentString();

    if (test_ret != 0)
	printf("Module xmlsave: %d errors\n", test_ret);
    return(test_ret);
}